

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtprawpacket.h
# Opt level: O0

void __thiscall jrtplib::RTPRawPacket::~RTPRawPacket(RTPRawPacket *this)

{
  RTPRawPacket *this_local;
  
  (this->super_RTPMemoryObject)._vptr_RTPMemoryObject = (_func_int **)&PTR__RTPRawPacket_00192b58;
  DeleteData(this);
  RTPMemoryObject::~RTPMemoryObject(&this->super_RTPMemoryObject);
  return;
}

Assistant:

inline RTPRawPacket::~RTPRawPacket()
{
	DeleteData();
}